

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElectromagneticEmissionSystemData.cpp
# Opt level: O1

int __thiscall
DIS::ElectromagneticEmissionSystemData::getMarshalledSize(ElectromagneticEmissionSystemData *this)

{
  undefined8 *puVar1;
  int iVar2;
  int iVar3;
  pointer pEVar4;
  long lVar5;
  ulong uVar6;
  ElectromagneticEmissionBeamData listElement;
  ElectromagneticEmissionBeamData local_90;
  
  iVar2 = EmitterSystem::getMarshalledSize(&this->_emitterSystem);
  iVar3 = Vector3Float::getMarshalledSize(&this->_location);
  iVar2 = iVar2 + iVar3 + 4;
  pEVar4 = (this->_beamDataRecords).
           super__Vector_base<DIS::ElectromagneticEmissionBeamData,_std::allocator<DIS::ElectromagneticEmissionBeamData>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->_beamDataRecords).
      super__Vector_base<DIS::ElectromagneticEmissionBeamData,_std::allocator<DIS::ElectromagneticEmissionBeamData>_>
      ._M_impl.super__Vector_impl_data._M_finish != pEVar4) {
    lVar5 = 0x48;
    uVar6 = 0;
    do {
      local_90._vptr_ElectromagneticEmissionBeamData =
           (_func_int **)&PTR__ElectromagneticEmissionBeamData_0019fb90;
      local_90._8_4_ = *(undefined4 *)((long)pEVar4 + lVar5 + -0x40);
      local_90._fundamentalParameterData._vptr_FundamentalParameterData =
           (_func_int **)&PTR__FundamentalParameterData_001a0138;
      local_90._fundamentalParameterData._40_8_ = *(undefined8 *)((long)pEVar4 + lVar5 + -0x10);
      puVar1 = (undefined8 *)((long)pEVar4 + lVar5 + -0x30);
      local_90._fundamentalParameterData._8_8_ = *puVar1;
      local_90._fundamentalParameterData._16_8_ = puVar1[1];
      puVar1 = (undefined8 *)((long)pEVar4 + lVar5 + -0x20);
      local_90._fundamentalParameterData._24_8_ = *puVar1;
      local_90._fundamentalParameterData._32_8_ = puVar1[1];
      local_90._64_8_ = *(undefined8 *)((long)pEVar4 + lVar5 + -8);
      std::vector<DIS::TrackJamTarget,_std::allocator<DIS::TrackJamTarget>_>::vector
                (&local_90._trackJamTargets,
                 (vector<DIS::TrackJamTarget,_std::allocator<DIS::TrackJamTarget>_> *)
                 ((long)&pEVar4->_vptr_ElectromagneticEmissionBeamData + lVar5));
      iVar3 = ElectromagneticEmissionBeamData::getMarshalledSize(&local_90);
      iVar2 = iVar2 + iVar3;
      ElectromagneticEmissionBeamData::~ElectromagneticEmissionBeamData(&local_90);
      uVar6 = uVar6 + 1;
      pEVar4 = (this->_beamDataRecords).
               super__Vector_base<DIS::ElectromagneticEmissionBeamData,_std::allocator<DIS::ElectromagneticEmissionBeamData>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar5 = lVar5 + 0x60;
    } while (uVar6 < (ulong)(((long)(this->_beamDataRecords).
                                    super__Vector_base<DIS::ElectromagneticEmissionBeamData,_std::allocator<DIS::ElectromagneticEmissionBeamData>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar4 >> 5)
                            * -0x5555555555555555));
  }
  return iVar2;
}

Assistant:

int ElectromagneticEmissionSystemData::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = marshalSize + 1;  // _systemDataLength
   marshalSize = marshalSize + 1;  // _numberOfBeams
   marshalSize = marshalSize + 2;  // _emissionsPadding2
   marshalSize = marshalSize + _emitterSystem.getMarshalledSize();  // _emitterSystem
   marshalSize = marshalSize + _location.getMarshalledSize();  // _location

   for(unsigned long long idx=0; idx < _beamDataRecords.size(); idx++)
   {
        ElectromagneticEmissionBeamData listElement = _beamDataRecords[idx];
        marshalSize = marshalSize + listElement.getMarshalledSize();
    }

    return marshalSize;
}